

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O2

bool M_WriteFile(char *name,void *source,int length)

{
  int __fd;
  ssize_t sVar1;
  bool bVar2;
  
  bVar2 = false;
  __fd = open(name,0x241,0x1b6);
  if (__fd != -1) {
    sVar1 = write(__fd,source,(long)length);
    close(__fd);
    bVar2 = length <= (int)sVar1;
  }
  return bVar2;
}

Assistant:

bool M_WriteFile (char const *name, void *source, int length)
{
	int handle;
	int count;

	handle = open ( name, O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);

	if (handle == -1)
		return false;

	count = write (handle, source, length);
	close (handle);

	if (count < length)
		return false;

	return true;
}